

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O1

bool __thiscall gutil::Parameter::isNextParameter(Parameter *this)

{
  ulong uVar1;
  pointer pbVar2;
  iterator iVar3;
  
  uVar1 = this->pos;
  pbVar2 = (this->list).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar1 < (ulong)((long)(this->list).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) &&
     (*pbVar2[uVar1]._M_dataplus._M_p == '-')) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->allparam)._M_t,pbVar2 + uVar1);
    return (_Rb_tree_header *)iVar3._M_node != &(this->allparam)._M_t._M_impl.super__Rb_tree_header;
  }
  return false;
}

Assistant:

bool Parameter::isNextParameter()
{
  bool ret=false;

  if (pos < list.size())
    if (list[pos][0] == '-')
      if (allparam.find(list[pos]) != allparam.end())
      {
        ret=true;
      }

  return ret;
}